

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

void __thiscall Clasp::Cli::ClaspAppBase::setup(ClaspAppBase *this)

{
  EventHandler *this_00;
  uint uVar1;
  int iVar2;
  Verbosity VVar3;
  ClaspFacade *this_01;
  undefined4 extraout_var;
  ulong uVar4;
  LemmaLogger *this_02;
  ulong uVar5;
  Verbosity verb;
  allocator local_41;
  string local_40;
  
  uVar1 = (*(this->super_Application)._vptr_Application[0x15])();
  this_01 = (ClaspFacade *)operator_new(0x1a8);
  ClaspFacade::ClaspFacade(this_01);
  SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::reset(&this->clasp_,this_01);
  if ((this->claspAppOpts_).onlyPre == '\0') {
    iVar2 = (*(this->super_Application)._vptr_Application[0x18])(this,(ulong)uVar1);
    SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::reset
              (&this->out_,(Output *)CONCAT44(extraout_var,iVar2));
    VVar3 = Potassco::Application::verbose(&this->super_Application);
    verb = verbosity_max;
    if (VVar3 < verbosity_max) {
      verb = VVar3;
    }
    uVar4 = (this->out_).ptr_ & 0xfffffffffffffffe;
    if ((uVar4 != 0) && (VVar3 = *(Verbosity *)(uVar4 + 0x28), VVar3 < verb)) {
      verb = VVar3;
    }
    if ((this->claspAppOpts_).lemmaLog._M_string_length != 0) {
      this_02 = (LemmaLogger *)operator_new(0x40);
      std::__cxx11::string::string
                ((string *)&local_40,(this->claspAppOpts_).lemmaLog._M_dataplus._M_p,&local_41);
      LemmaLogger::LemmaLogger(this_02,&local_40,&(this->claspAppOpts_).lemma);
      SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject>::reset(&this->logger_,this_02);
      std::__cxx11::string::~string((string *)&local_40);
    }
    this_00 = &this->super_EventHandler;
    EventHandler::setVerbosity(this_00,subsystem_facade,verb);
    EventHandler::setVerbosity(this_00,subsystem_load,verb);
    EventHandler::setVerbosity(this_00,subsystem_prepare,verb);
    EventHandler::setVerbosity(this_00,subsystem_solve,verb);
    uVar5 = (this->clasp_).ptr_ & 0xfffffffffffffffe;
    uVar4 = (this->logger_).ptr_;
    *(EventHandler **)(uVar5 + 0x108) = this_00;
    *(uint *)(uVar5 + 0x118) = *(uint *)(uVar5 + 0x118) & 0x3fffffff | (uint)(1 < uVar4) << 0x1e;
  }
  return;
}

Assistant:

void ClaspAppBase::setup() {
	ProblemType pt = getProblemType();
	clasp_         = new ClaspFacade();
	if (setFpuMode()) { fpuMode_ = fpuInit(); }
	if (!claspAppOpts_.onlyPre) {
		out_ = createOutput(pt);
		Event::Verbosity verb	= (Event::Verbosity)std::min(verbose(), (uint32)Event::verbosity_max);
		if (out_.get() && out_->verbosity() < (uint32)verb) { verb = (Event::Verbosity)out_->verbosity(); }
		if (!claspAppOpts_.lemmaLog.empty()) {
			logger_ = new LemmaLogger(claspAppOpts_.lemmaLog.c_str(), claspAppOpts_.lemma);
		}
		EventHandler::setVerbosity(Event::subsystem_facade , verb);
		EventHandler::setVerbosity(Event::subsystem_load   , verb);
		EventHandler::setVerbosity(Event::subsystem_prepare, verb);
		EventHandler::setVerbosity(Event::subsystem_solve  , verb);
		clasp_->ctx.setEventHandler(this, logger_.get() == 0 ? SharedContext::report_default : SharedContext::report_conflict);
	}
}